

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strcasecmp(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 iValue;
  sxu32 local_5c;
  sxu32 local_40;
  int res;
  int n2;
  int n1;
  char *z2;
  char *z1;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  z1 = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_int(pCtx,(uint)(nArg != 0));
  }
  else {
    z2 = jx9_value_to_string(*apArg,&res);
    _n2 = jx9_value_to_string(*(jx9_value **)(z1 + 8),(int *)&local_40);
    if (res < (int)local_40) {
      local_5c = local_40;
    }
    else {
      local_5c = res;
    }
    iValue = SyStrnicmp(z2,_n2,local_5c);
    jx9_result_int(pjStack_18,iValue);
  }
  return 0;
}

Assistant:

static int jx9Builtin_strcasecmp(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *z1, *z2;
	int n1, n2;
	int res;
	if( nArg < 2 ){
		res = nArg == 0 ? 0 : 1;
		jx9_result_int(pCtx, res);
		return JX9_OK;
	}
	/* Perform the comparison */
	z1 = jx9_value_to_string(apArg[0], &n1);
	z2 = jx9_value_to_string(apArg[1], &n2);
	res = SyStrnicmp(z1, z2, (sxu32)(SXMAX(n1, n2)));
	/* Comparison result */
	jx9_result_int(pCtx, res);
	return JX9_OK;
}